

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextVkImpl.cpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextVkImpl::TransitionOrVerifyTextureState
          (DeviceContextVkImpl *this,TextureVkImpl *Texture,
          RESOURCE_STATE_TRANSITION_MODE TransitionMode,RESOURCE_STATE RequiredState,
          VkImageLayout ExpectedLayout,char *OperationName)

{
  bool bVar1;
  VkImageLayout VVar2;
  RenderPassVkImpl *pRVar3;
  Char *pCVar4;
  char (*Args_1) [38];
  undefined1 local_80 [8];
  string msg_1;
  undefined1 local_50 [8];
  string msg;
  char *OperationName_local;
  VkImageLayout ExpectedLayout_local;
  RESOURCE_STATE RequiredState_local;
  RESOURCE_STATE_TRANSITION_MODE TransitionMode_local;
  TextureVkImpl *Texture_local;
  DeviceContextVkImpl *this_local;
  
  msg.field_2._8_8_ = OperationName;
  if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION) {
    pRVar3 = Diligent::RefCntAutoPtr::operator_cast_to_RenderPassVkImpl_
                       ((RefCntAutoPtr *)
                        &(this->super_DeviceContextNextGenBase<Diligent::EngineVkImplTraits>).
                         super_DeviceContextBase<Diligent::EngineVkImplTraits>.m_pActiveRenderPass);
    if (pRVar3 != (RenderPassVkImpl *)0x0) {
      FormatString<char[55]>
                ((string *)local_50,
                 (char (*) [55])"State transitions are not allowed inside a render pass");
      pCVar4 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar4,"TransitionOrVerifyTextureState",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                 ,0xc1e);
      std::__cxx11::string::~string((string *)local_50);
    }
    bVar1 = TextureBase<Diligent::EngineVkImplTraits>::IsInKnownState
                      (&Texture->super_TextureBase<Diligent::EngineVkImplTraits>);
    if (bVar1) {
      Args_1 = (char (*) [38])(ulong)RequiredState;
      TransitionTextureState
                (this,Texture,RESOURCE_STATE_UNKNOWN,RequiredState,
                 STATE_TRANSITION_FLAG_UPDATE_STATE,(VkImageSubresourceRange *)0x0);
      VVar2 = TextureVkImpl::GetLayout(Texture);
      if (VVar2 != ExpectedLayout) {
        FormatString<char[26],char[38]>
                  ((string *)local_80,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"Texture.GetLayout() == ExpectedLayout",Args_1);
        pCVar4 = (Char *)std::__cxx11::string::c_str();
        DebugAssertionFailed
                  (pCVar4,"TransitionOrVerifyTextureState",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/DeviceContextVkImpl.cpp"
                   ,0xc22);
        std::__cxx11::string::~string((string *)local_80);
      }
    }
  }
  else if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY) {
    DeviceContextBase<Diligent::EngineVkImplTraits>::DvpVerifyTextureState
              ((DeviceContextBase<Diligent::EngineVkImplTraits> *)this,Texture,RequiredState,
               OperationName);
  }
  return;
}

Assistant:

void DeviceContextVkImpl::TransitionOrVerifyTextureState(TextureVkImpl&                 Texture,
                                                         RESOURCE_STATE_TRANSITION_MODE TransitionMode,
                                                         RESOURCE_STATE                 RequiredState,
                                                         VkImageLayout                  ExpectedLayout,
                                                         const char*                    OperationName)
{
    if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_TRANSITION)
    {
        VERIFY(m_pActiveRenderPass == nullptr, "State transitions are not allowed inside a render pass");
        if (Texture.IsInKnownState())
        {
            TransitionTextureState(Texture, RESOURCE_STATE_UNKNOWN, RequiredState, STATE_TRANSITION_FLAG_UPDATE_STATE);
            VERIFY_EXPR(Texture.GetLayout() == ExpectedLayout);
        }
    }
#ifdef DILIGENT_DEVELOPMENT
    else if (TransitionMode == RESOURCE_STATE_TRANSITION_MODE_VERIFY)
    {
        DvpVerifyTextureState(Texture, RequiredState, OperationName);
    }
#endif
}